

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O1

TestStatus *
vkt::clipping::anon_unknown_0::ClipVolume::testPrimitivesOutside
          (TestStatus *__return_storage_ptr__,Context *context,VkPrimitiveTopology topology)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  char *__s;
  VkPrimitiveTopology topology_;
  int iVar2;
  const_iterator cVar3;
  size_t sVar4;
  TestStatus *pTVar5;
  int iVar6;
  long lVar7;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VulkanDrawContext drawContext;
  DrawState drawState;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> local_328;
  Context *local_308;
  VkPrimitiveTopology local_2fc;
  TestStatus *local_2f8;
  undefined1 local_2f0 [16];
  int local_2e0;
  int local_2dc [2];
  int local_2d4;
  void *local_2d0;
  TestLog *local_2c8;
  VulkanProgram local_2c0;
  DrawCallData local_2b8;
  IVec2 local_2b0;
  IVec2 local_2a8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_2a0;
  Vec4 local_288;
  undefined1 local_278 [16];
  int local_268;
  int local_264 [2];
  int local_25c;
  void *local_258;
  Vec4 local_250;
  undefined1 local_240 [8];
  VkPrimitiveTopology local_238;
  VkFormat VStack_234;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [6];
  ios_base local_1c8 [380];
  DrawState local_4c;
  
  local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Shader *)0x0;
  local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Shader *)0x0;
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_308 = context;
  local_2fc = topology;
  local_240 = (undefined1  [8])local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"vert","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_240);
  local_2f0._8_8_ = *(undefined8 *)(cVar3._M_node + 2);
  local_2f0._0_4_ = VK_SHADER_STAGE_VERTEX_BIT;
  if (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&local_328,
               (iterator)
               local_328.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish,(Shader *)local_2f0);
  }
  else {
    *(undefined8 *)
     local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_2f0._0_8_;
    (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary = (ProgramBinary *)local_2f0._8_8_;
    local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_240 != (undefined1  [8])local_230) {
    operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
  }
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)local_308->m_progCollection;
  local_240 = (undefined1  [8])local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"frag","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_240);
  local_2f0._8_4_ = cVar3._M_node[2]._M_color;
  local_2f0._12_4_ = *(int *)&cVar3._M_node[2].field_0x4;
  local_2f0._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
  if (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&local_328,
               (iterator)
               local_328.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish,(Shader *)local_2f0);
  }
  else {
    *(undefined8 *)
     local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_2f0._0_8_;
    (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary = (ProgramBinary *)local_2f0._8_8_;
    local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_240 != (undefined1  [8])local_230) {
    operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
  }
  local_2c8 = local_308->m_testCtx->m_log;
  local_240 = (undefined1  [8])local_2c8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
  local_2f8 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_238,
             "Drawing primitives outside the clip volume. Expecting an empty image.",0x45);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  lVar7 = 0;
  iVar6 = 0;
  do {
    local_240 = (undefined1  [8])local_2c8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    __s = *(char **)((long)&testPrimitivesOutside::cases[0].desc + lVar7);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_238 +
                      (int)*(undefined8 *)(CONCAT44(VStack_234,local_238) + -0x18));
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,__s,sVar4);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    topology_ = local_2fc;
    local_238 = *(VkPrimitiveTopology *)((long)&testPrimitivesOutside::cases[0].zPos + lVar7);
    local_240 = (undefined1  [8])0x0;
    VStack_234 = VK_FORMAT_UNDEFINED;
    genVertices(&local_2a0,local_2fc,(Vec4 *)local_240,0.0);
    drawutil::DrawState::DrawState(&local_4c,topology_,0x10,0x10);
    local_2c0.shaders = &local_328;
    local_2b8.vertices = &local_2a0;
    drawutil::VulkanDrawContext::VulkanDrawContext
              ((VulkanDrawContext *)local_240,local_308,&local_4c,&local_2b8,&local_2c0);
    drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_240);
    drawutil::VulkanDrawContext::getColorPixels
              ((ConstPixelBufferAccess *)local_278,(VulkanDrawContext *)local_240);
    local_250.m_data[0] = 0.0;
    local_250.m_data[1] = 0.0;
    local_250.m_data[2] = 0.0;
    local_250.m_data[3] = 1.0;
    local_288.m_data[0] = 0.0;
    local_288.m_data[1] = 0.0;
    local_288.m_data[2] = 0.0;
    local_288.m_data[3] = 0.0;
    local_2f0._0_8_ = local_278._0_8_;
    local_2e0 = local_268;
    local_2f0._8_8_ = local_278._8_8_;
    local_2d4 = local_25c;
    local_2dc[0] = local_264[0];
    local_2dc[1] = local_264[1];
    local_2d0 = local_258;
    local_2b0.m_data[0] = 0;
    local_2b0.m_data[1] = 0;
    local_2a8.m_data[0] = local_278._8_4_;
    local_2a8.m_data[1] = local_278._12_4_;
    iVar2 = countPixels((ConstPixelBufferAccess *)local_2f0,&local_2b0,&local_2a8,&local_250,
                        &local_288);
    drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_240);
    if (local_2a0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a0.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a0.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar6 = iVar6 + (uint)(iVar2 == 0x100);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 == 0x10);
  local_240 = (undefined1  [8])local_230;
  if (iVar6 == 2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"OK","");
    pTVar5 = local_2f8;
    local_2f8->m_code = QP_TEST_RESULT_PASS;
    (local_2f8->m_description)._M_dataplus._M_p = (pointer)&(local_2f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8->m_description,local_240,
               (char *)((long)local_240 + CONCAT44(VStack_234,local_238)));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"Rendered image(s) are incorrect","");
    pTVar5 = local_2f8;
    local_2f8->m_code = QP_TEST_RESULT_FAIL;
    (local_2f8->m_description)._M_dataplus._M_p = (pointer)&(local_2f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8->m_description,local_240,
               (char *)((long)local_240 + CONCAT44(VStack_234,local_238)));
  }
  if (local_240 != (undefined1  [8])local_230) {
    operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
  }
  if (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar5;
}

Assistant:

tcu::TestStatus testPrimitivesOutside (Context& context, const VkPrimitiveTopology topology)
{
	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	tcu::TestLog&	log			= context.getTestContext().getLog();
	int				numPassed	= 0;

	static const struct
	{
		const char* const	desc;
		float				zPos;
	} cases[] =
	{
		{ "Draw primitives in front of the near clipping plane, z < 0.0",	-0.5f, },
		{ "Draw primitives behind the far clipping plane, z > 1.0",			 1.5f, },
	};

	log << tcu::TestLog::Message << "Drawing primitives outside the clip volume. Expecting an empty image." << tcu::TestLog::EndMessage;

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		log << tcu::TestLog::Message << cases[caseNdx].desc << tcu::TestLog::EndMessage;

		const std::vector<Vec4> vertices = genVertices(topology, Vec4(0.0f, 0.0f, cases[caseNdx].zPos, 0.0f), 0.0f);
		DrawState				drawState		(topology, RENDER_SIZE, RENDER_SIZE);
		DrawCallData			drawCallData	(vertices);
		VulkanProgram			vulkanProgram	(shaders);

		VulkanDrawContext		drawContext(context, drawState, drawCallData, vulkanProgram);
		drawContext.draw();

		// All pixels must be black -- nothing is drawn.
		const int numBlackPixels = countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());
		if (numBlackPixels == NUM_RENDER_PIXELS)
			++numPassed;
	}

	return (numPassed == DE_LENGTH_OF_ARRAY(cases) ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}